

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

OpenMDBitSet * OpenMD::operator&(OpenMDBitSet *bs1,OpenMDBitSet *bs2)

{
  OpenMDBitSet *in_RDI;
  OpenMDBitSet *result;
  OpenMDBitSet *in_stack_ffffffffffffffb8;
  
  OpenMDBitSet::OpenMDBitSet(in_RDI,in_stack_ffffffffffffffb8);
  OpenMDBitSet::operator&=(in_RDI,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

OpenMDBitSet operator&(const OpenMDBitSet& bs1, const OpenMDBitSet& bs2) {
    assert(bs1.size() == bs2.size());

    OpenMDBitSet result(bs1);
    result &= bs2;
    return result;
  }